

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intermediate.cpp
# Opt level: O2

TIntermSymbol * __thiscall
glslang::TIntermediate::addSymbol(TIntermediate *this,TIntermSymbol *intermSymbol)

{
  TIntermTyped *constSubtree;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermSymbol *pTVar6;
  
  iVar1 = (*(intermSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])
                    (intermSymbol);
  iVar2 = (*(intermSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])
                    (intermSymbol);
  iVar3 = (*(intermSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])
                    (intermSymbol);
  iVar4 = (*(intermSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                    (intermSymbol);
  constSubtree = intermSymbol->constSubtree;
  iVar5 = (**(intermSymbol->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode)(intermSymbol);
  pTVar6 = addSymbol(this,CONCAT44(extraout_var,iVar1),(TString *)CONCAT44(extraout_var_00,iVar2),
                     (TString *)CONCAT44(extraout_var_01,iVar3),
                     (TType *)CONCAT44(extraout_var_02,iVar4),&intermSymbol->constArray,constSubtree
                     ,(TSourceLoc *)CONCAT44(extraout_var_03,iVar5));
  return pTVar6;
}

Assistant:

TIntermSymbol* TIntermediate::addSymbol(const TIntermSymbol& intermSymbol)
{
    return addSymbol(intermSymbol.getId(),
                     intermSymbol.getName(),
                     intermSymbol.getMangledName(),
                     intermSymbol.getType(),
                     intermSymbol.getConstArray(),
                     intermSymbol.getConstSubtree(),
                     intermSymbol.getLoc());
}